

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

void Ivy_CutComputeAll(Ivy_Man_t *p,int nInputs)

{
  Ivy_Obj_t *pObj;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  int level;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (nInputs < 7) {
    uVar8 = -(p->nObjs[5] + p->nObjs[6]);
    pVVar2 = p->vObjs;
    uVar4 = uVar8;
    if (pVVar2->nSize < 1) {
      uVar6 = 0;
      uVar7 = 0;
    }
    else {
      lVar5 = 0;
      uVar7 = 0;
      uVar6 = 0;
      do {
        pObj = (Ivy_Obj_t *)pVVar2->pArray[lVar5];
        if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
          Ivy_CutComputeForNode(p,pObj,nInputs);
          uVar8 = uVar8 + Ivy_CutComputeForNode::CutStore.nCuts;
          uVar4 = uVar4 + Ivy_CutComputeForNode::CutStore.nCutsM;
          uVar7 = uVar7 + Ivy_CutComputeForNode::CutStore.fSatur;
          uVar6 = uVar6 + 1;
        }
        lVar5 = lVar5 + 1;
        pVVar2 = p->vObjs;
      } while (lVar5 < pVVar2->nSize);
    }
    iVar1 = 0x93c1d7;
    printf("All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ",(ulong)uVar8,
           (ulong)uVar4,(ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar6,
           (ulong)uVar7);
    Abc_Print(iVar1,"%s =","Time");
    level = 3;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  }
  else {
    printf("Cannot compute cuts for more than %d inputs.\n",6);
  }
  return;
}

Assistant:

void Ivy_CutComputeAll( Ivy_Man_t * p, int nInputs )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    int i, nCutsTotal, nCutsTotalM, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    if ( nInputs > IVY_CUT_INPUT )
    {
        printf( "Cannot compute cuts for more than %d inputs.\n", IVY_CUT_INPUT );
        return;
    }
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = nCutsTotalM = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_CutComputeForNode( p, pObj, nInputs );
        nCutsTotal  += pStore->nCuts;
        nCutsTotalM += pStore->nCutsM;
        nNodeOver   += pStore->fSatur;
        nNodeTotal++;
    }
    printf( "All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ", 
        nCutsTotal, nCutsTotalM, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}